

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O0

Attribute * Imf_2_5::Attribute::newAttribute(char *typeName)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this;
  pointer ppVar3;
  Lock *this_00;
  char *in_RDI;
  stringstream _iex_throw_s;
  const_iterator i;
  Lock lock;
  LockedTypeMap *tMap;
  map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
  *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined1 autoLock;
  Mutex *in_stack_fffffffffffffe08;
  Lock *in_stack_fffffffffffffe10;
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_> local_48 [3];
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_> local_28 [3];
  LockedTypeMap *local_10;
  char *local_8;
  
  autoLock = (undefined1)((ulong)in_stack_fffffffffffffe00 >> 0x38);
  local_8 = in_RDI;
  local_10 = anon_unknown_0::typeMap();
  IlmThread_2_5::Lock::Lock(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(bool)autoLock);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
       ::find(in_stack_fffffffffffffdf8,(key_type *)0x11910f);
  std::_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>::
  _Rb_tree_const_iterator(local_28,&local_30);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
       ::end(in_stack_fffffffffffffdf8);
  std::_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>::
  _Rb_tree_const_iterator(local_48,&local_50);
  bVar1 = std::operator==(local_28,local_48);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>
                           *)0x119255);
    this_00 = (Lock *)(*ppVar3->second)();
    IlmThread_2_5::Lock::~Lock(this_00);
    return (Attribute *)this_00;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1d8);
  poVar2 = std::operator<<(local_1c8,"Cannot create image file attribute of unknown type \"");
  poVar2 = std::operator<<(poVar2,local_8);
  std::operator<<(poVar2,"\".");
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,local_1d8);
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

Attribute *
Attribute::newAttribute (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    TypeMap::const_iterator i = tMap.find (typeName);

    if (i == tMap.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot create image file attribute of "
			    "unknown type \"" << typeName << "\".");

    return (i->second)();
}